

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

int __thiscall CharFieldSourceByteArray::arraylen(CharFieldSourceByteArray *this,CVmPackType *t)

{
  byte bVar1;
  int iVar2;
  undefined4 *in_RSI;
  long in_RDI;
  unsigned_long i;
  int ret;
  unsigned_long in_stack_ffffffffffffffb8;
  CVmObjByteArray *in_stack_ffffffffffffffc0;
  ulong local_28;
  int local_1c;
  int local_4;
  
  switch(*in_RSI) {
  case 0x41:
  case 0x61:
  case 0x62:
    local_4 = (int)*(undefined8 *)(in_RDI + 0x18);
    break;
  default:
    local_4 = 0;
    break;
  case 0x48:
  case 0x68:
    if (in_RSI[10] == 0) {
      local_4 = (int)*(undefined8 *)(in_RDI + 0x18);
    }
    else {
      local_4 = (int)(*(long *)(in_RDI + 0x18) + 1U >> 1);
    }
    break;
  case 0x55:
  case 0x75:
    local_1c = 0;
    for (local_28 = 1; local_28 <= *(ulong *)(in_RDI + 0x18); local_28 = local_28 + 1) {
      bVar1 = CVmObjByteArray::get_element(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      iVar2 = 2;
      if (bVar1 < 0x80) {
        iVar2 = 1;
      }
      local_1c = iVar2 + local_1c;
    }
    local_4 = local_1c;
    break;
  case 0x57:
  case 0x77:
    if (in_RSI[10] == 0) {
      local_4 = (int)*(undefined8 *)(in_RDI + 0x18);
    }
    else {
      local_4 = (int)(*(long *)(in_RDI + 0x18) << 1);
    }
  }
  return local_4;
}

Assistant:

virtual int arraylen(CVmPackType *t)
    {
        switch (t->type_code)
        {
        case 'a':
        case 'A':
        case 'b':
            /* 
             *   the length is in bytes, and we write one byte per character;
             *   we treat each byte in the array as a Latin-1 character, so
             *   this is the same as our array length 
             */
            return (int)len;

        case 'w':
        case 'W':
            /* 
             *   The length is in characters, or two bytes per character.  We
             *   treat our bytes as latin-1 characters, so the character
             *   count is the saqme as the array length. 
             */
            return (int)(t->count_in_bytes ? len*2 : len);
            
        case 'h':
        case 'H':
            /* 
             *   one character per array element, or one byte per pair of
             *   array elements 
             */
            return (int)(t->count_in_bytes ? (len+1)/2 : len);

        case 'u':
        case 'U':
            /* 
             *   The length is in bytes, in UTF-8 format.  We treat our array
             *   elements as Latin-1 characters.  In UTF-8, characters in the
             *   range 0-127 take one byte, and 128-255 take two bytes.  Run
             *   through our array and add up the required lengths.  
             */
            {
                int ret;
                unsigned long i;
                for (ret = 0, i = 1 ; i <= len ; ++i)
                    ret += arr->get_element(i) < 128 ? 1 : 2;

                /* return the length */
                return ret;
            }

        default:
            return 0;
        }
    }